

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

wchar_t * ma_copy_string_w(wchar_t *src,ma_allocation_callbacks *pAllocationCallbacks)

{
  size_t sVar1;
  wchar_t *in_RDI;
  wchar_t *dst;
  size_t sz;
  size_t in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  sVar1 = wcslen(in_RDI);
  local_8 = (wchar_t *)ma_malloc(in_stack_ffffffffffffffd8,(ma_allocation_callbacks *)0x2000e4);
  if (local_8 == (wchar_t *)0x0) {
    local_8 = (wchar_t *)0x0;
  }
  else {
    ma_wcscpy_s(local_8,sVar1 + 1,in_RDI);
  }
  return local_8;
}

Assistant:

MA_API MA_NO_INLINE wchar_t* ma_copy_string_w(const wchar_t* src, const ma_allocation_callbacks* pAllocationCallbacks)
{
    size_t sz = wcslen(src)+1;
    wchar_t* dst = (wchar_t*)ma_malloc(sz * sizeof(*dst), pAllocationCallbacks);
    if (dst == NULL) {
        return NULL;
    }

    ma_wcscpy_s(dst, sz, src);

    return dst;
}